

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse-matrix.hpp
# Opt level: O0

tuple<const_baryonyx::sparse_matrix<int>::row_value_*,_const_baryonyx::sparse_matrix<int>::row_value_*>
 __thiscall baryonyx::sparse_matrix<int>::row(sparse_matrix<int> *this,int row)

{
  bool bVar1;
  const_iterator prVar2;
  int *piVar3;
  size_type in_EDX;
  undefined4 in_register_00000034;
  sparse_matrix<int> *this_00;
  tuple<const_baryonyx::sparse_matrix<int>::row_value_*,_const_baryonyx::sparse_matrix<int>::row_value_*>
  tVar4;
  const_row_iterator end;
  const_row_iterator begin;
  sparse_matrix<int> *psStack_18;
  int row_local;
  sparse_matrix<int> *this_local;
  
  this_00 = (sparse_matrix<int> *)CONCAT44(in_register_00000034,row);
  begin._4_4_ = in_EDX;
  psStack_18 = this_00;
  this_local = this;
  bVar1 = m_is_valid_index(this_00,in_EDX,0);
  if (!bVar1) {
    details::fail_fast("Precondition","m_is_valid_index(row, 0)",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/sparse-matrix.hpp"
                       ,"211");
  }
  prVar2 = fixed_array<baryonyx::sparse_matrix<int>::row_value>::begin(&this_00->m_rows_values);
  piVar3 = fixed_array<int>::operator[]((fixed_array<int> *)this_00,begin._4_4_);
  end = prVar2 + *piVar3;
  fixed_array<baryonyx::sparse_matrix<int>::row_value>::begin(&this_00->m_rows_values);
  fixed_array<int>::operator[]((fixed_array<int> *)this_00,begin._4_4_ + 1);
  tVar4 = std::
          make_tuple<baryonyx::sparse_matrix<int>::row_value_const*&,baryonyx::sparse_matrix<int>::row_value_const*&>
                    ((row_value **)this,&end);
  tVar4.
  super__Tuple_impl<0UL,_const_baryonyx::sparse_matrix<int>::row_value_*,_const_baryonyx::sparse_matrix<int>::row_value_*>
  .super__Tuple_impl<1UL,_const_baryonyx::sparse_matrix<int>::row_value_*>.
  super__Head_base<1UL,_const_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
       (_Head_base<1UL,_const_baryonyx::sparse_matrix<int>::row_value_*,_false>)
       (_Head_base<1UL,_const_baryonyx::sparse_matrix<int>::row_value_*,_false>)this;
  return (tuple<const_baryonyx::sparse_matrix<int>::row_value_*,_const_baryonyx::sparse_matrix<int>::row_value_*>
          )tVar4.
           super__Tuple_impl<0UL,_const_baryonyx::sparse_matrix<int>::row_value_*,_const_baryonyx::sparse_matrix<int>::row_value_*>
  ;
}

Assistant:

std::tuple<const_row_iterator, const_row_iterator> row(int row) const
      noexcept
    {
        bx_expects(m_is_valid_index(row, 0));

        const_row_iterator begin = m_rows_values.begin() + m_rows_access[row];
        const_row_iterator end =
          m_rows_values.begin() + m_rows_access[row + 1];

        return std::make_tuple(begin, end);
    }